

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

uint64_t __thiscall banksia::BoardCore::xorHashKey(BoardCore *this,int pos)

{
  Side SVar1;
  PieceType PVar2;
  const_reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  int in_ESI;
  long in_RDI;
  unsigned_long h;
  size_type sz;
  int p;
  int sd;
  
  pvVar3 = std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::operator[]
                     ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 8),
                      (long)in_ESI);
  SVar1 = pvVar3->side;
  pvVar3 = std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::operator[]
                     ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 8),
                      (long)in_ESI);
  PVar2 = pvVar3->type;
  sVar4 = std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::size
                    ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 8));
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&hashTable,
                      (long)(int)(SVar1 * 7) * sVar4 + (long)(int)PVar2 * sVar4 + (long)in_ESI);
  return *pvVar5;
}

Assistant:

u64 BoardCore::xorHashKey(int pos) const
{
    assert(isPositionValid(pos ));
    
    assert(!pieces[size_t(pos)].isEmpty());
    int sd = static_cast<int>(pieces[size_t(pos)].side);
    int p = static_cast<int>(pieces[size_t(pos)].type);
    
    auto sz = pieces.size(); assert(sz == 64);
    auto h = sd * 7 * sz + p * sz + size_t(pos); assert(h < hashTable.size());
    return hashTable[h];
}